

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::anon_unknown_12::StrCpy(char *src,char **dst_ptr)

{
  size_t __n;
  char *pcVar1;
  size_t size;
  char **dst;
  char **dst_ptr_local;
  char *src_local;
  
  if (dst_ptr == (char **)0x0) {
    src_local._7_1_ = false;
  }
  else {
    if (*dst_ptr != (char *)0x0) {
      operator_delete__(*dst_ptr);
    }
    *dst_ptr = (char *)0x0;
    if (src == (char *)0x0) {
      src_local._7_1_ = true;
    }
    else {
      __n = strlen(src);
      pcVar1 = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
      *dst_ptr = pcVar1;
      if (*dst_ptr == (char *)0x0) {
        src_local._7_1_ = false;
      }
      else {
        memcpy(*dst_ptr,src,__n);
        (*dst_ptr)[__n] = '\0';
        src_local._7_1_ = true;
      }
    }
  }
  return src_local._7_1_;
}

Assistant:

bool StrCpy(const char* src, char** dst_ptr) {
  if (dst_ptr == NULL)
    return false;

  char*& dst = *dst_ptr;

  delete[] dst;
  dst = NULL;

  if (src == NULL)
    return true;

  const size_t size = strlen(src) + 1;

  dst = new (std::nothrow) char[size];  // NOLINT
  if (dst == NULL)
    return false;

  memcpy(dst, src, size - 1);
  dst[size - 1] = '\0';
  return true;
}